

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function.h
# Opt level: O1

void __thiscall xLearn::Score::~Score(Score *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Score() { }